

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

FILE * OpenFileOrDie(char *filename,char *mode)

{
  FILE *pFVar1;
  ostream *poVar2;
  allocator local_5e;
  allocator local_5d;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (filename == (char *)0x0) {
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_58,"OpenFileOrDie",&local_5e);
    poVar2 = Logger::Start(ERR,&local_38,0x89,&local_58);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x89);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"filename");
    std::operator<<(poVar2," == NULL \n");
  }
  else {
    if (mode != (char *)0x0) {
      pFVar1 = fopen(filename,mode);
      if (pFVar1 == (FILE *)0x0) {
        local_5c.severity_ = FATAL;
        std::__cxx11::string::string
                  ((string *)&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                   ,&local_5d);
        std::__cxx11::string::string((string *)&local_58,"OpenFileOrDie",&local_5e);
        poVar2 = Logger::Start(FATAL,&local_38,0x8d,&local_58);
        poVar2 = std::operator<<(poVar2,"Cannot open file: ");
        poVar2 = std::operator<<(poVar2,filename);
        poVar2 = std::operator<<(poVar2," with mode: ");
        std::operator<<(poVar2,mode);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_38);
        Logger::~Logger(&local_5c);
      }
      return (FILE *)pFVar1;
    }
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_58,"OpenFileOrDie",&local_5e);
    poVar2 = Logger::Start(ERR,&local_38,0x8a,&local_58);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8a);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"mode");
    std::operator<<(poVar2," == NULL \n");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

inline FILE *OpenFileOrDie(const char *filename, const char *mode) {
  CHECK_NOTNULL(filename);
  CHECK_NOTNULL(mode);
  FILE *input_stream = fopen(filename, mode);
  if (input_stream == nullptr) {
    LOG(FATAL) << "Cannot open file: " << filename
               << " with mode: " << mode;
  }  
  return input_stream;
}